

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O0

TestNode * __thiscall xe::TestNode::find(TestNode *this,char *path)

{
  bool bVar1;
  int compLen_00;
  deBool dVar2;
  TestNodeType TVar3;
  Error *this_00;
  char *name;
  int compLen;
  char *path_local;
  TestNode *this_local;
  
  if (this->m_nodeType == TESTNODETYPE_ROOT) {
    this_local = TestGroup::findChildNode((TestGroup *)this,path);
  }
  else {
    compLen_00 = getFirstComponentLength(path);
    do {
      dVar2 = deGetFalse();
      if (dVar2 != 0 || compLen_00 < 1) {
        this_00 = (Error *)__cxa_allocate_exception(0x10);
        Error::Error(this_00,(char *)0x0,"compLen > 0",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTestCase.cpp"
                     ,0x9d);
        __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
      }
      dVar2 = deGetFalse();
    } while (dVar2 != 0);
    name = getName(this);
    bVar1 = compareNameToPathComponent(name,path,compLen_00);
    if (bVar1) {
      this_local = this;
      if (path[compLen_00] != '\0') {
        TVar3 = getNodeType(this);
        if (TVar3 == TESTNODETYPE_GROUP) {
          this_local = TestGroup::findChildNode((TestGroup *)this,path + (long)compLen_00 + 1);
        }
        else {
          this_local = (TestNode *)0x0;
        }
      }
    }
    else {
      this_local = (TestNode *)0x0;
    }
  }
  return this_local;
}

Assistant:

const TestNode* TestNode::find (const char* path) const
{
	if (m_nodeType == TESTNODETYPE_ROOT)
	{
		// Don't need to consider current node.
		return static_cast<const TestGroup*>(this)->findChildNode(path);
	}
	else
	{
		// Check if first component matches this node.
		int compLen = getFirstComponentLength(path);
		XE_CHECK(compLen > 0);

		if (compareNameToPathComponent(getName(), path, compLen))
		{
			if (path[compLen] == 0)
				return this;
			else if (getNodeType() == TESTNODETYPE_GROUP)
				return static_cast<const TestGroup*>(this)->findChildNode(path + compLen + 1);
			else
				return DE_NULL;
		}
		else
			return DE_NULL;
	}
}